

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.c
# Opt level: O0

void CopyOptionValue(TidyDocImpl *doc,TidyOptionImpl *option,TidyOptionValue *oldval,
                    TidyOptionValue *newval)

{
  tmbstr ptVar1;
  Bool local_2c;
  Bool fire_callback;
  TidyOptionValue *newval_local;
  TidyOptionValue *oldval_local;
  TidyOptionImpl *option_local;
  TidyDocImpl *doc_local;
  
  local_2c = no;
  if (oldval == (TidyOptionValue *)0x0) {
    __assert_fail("oldval != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/geoffmcl[P]tidy-fork/src/config.c"
                  ,0x185,
                  "void CopyOptionValue(TidyDocImpl *, const TidyOptionImpl *, TidyOptionValue *, const TidyOptionValue *)"
                 );
  }
  if (doc->pConfigChangeCallback != (TidyConfigChangeCallback)0x0) {
    if (option->type == TidyString) {
      local_2c = OptionChangedValuesDiffer(oldval->p,newval->p);
    }
    else {
      local_2c = (Bool)(oldval->v != newval->v);
    }
  }
  FreeOptionValue(doc,option,oldval);
  if (option->type == TidyString) {
    if ((newval->v == 0) || ((ctmbstr)newval->v == option->pdflt)) {
      *oldval = *newval;
    }
    else {
      ptVar1 = prvTidytmbstrdup(doc->allocator,newval->p);
      oldval->p = ptVar1;
    }
  }
  else {
    *oldval = *newval;
  }
  if (local_2c != no) {
    PerformOptionChangedCallback(doc,option);
  }
  return;
}

Assistant:

static void CopyOptionValue( TidyDocImpl* doc, const TidyOptionImpl* option,
                             TidyOptionValue* oldval, const TidyOptionValue* newval )
{
    Bool fire_callback = no;
    assert( oldval != NULL );

    /* Compare the old and new values. */
    if ( doc->pConfigChangeCallback )
    {
        if ( option->type == TidyString )
            fire_callback = OptionChangedValuesDiffer( oldval->p, newval->p );
        else
            fire_callback = oldval->v != newval->v;
    }

    FreeOptionValue( doc, option, oldval );

    if ( option->type == TidyString )
    {
        if ( newval->p && newval->p != option->pdflt )
            oldval->p = TY_(tmbstrdup)( doc->allocator, newval->p );
        else
            oldval->p = newval->p;
    }
    else
        oldval->v = newval->v;

    if ( fire_callback )
        PerformOptionChangedCallback( doc, option );
}